

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O2

void fiowrtsym(void *ctx0,toksdef *t)

{
  errcxdef *ctx;
  FILE *__s;
  uint16_t tmp;
  size_t sVar1;
  ulong __n;
  uchar buf [89];
  
  ctx = *(errcxdef **)((long)ctx0 + 8);
  __s = *(FILE **)((long)ctx0 + 0x10);
  buf[0] = t->tokslen;
  __n = (ulong)buf[0];
  buf[1] = t->tokstyp;
  buf._2_2_ = t->toksval;
  memcpy(buf + 4,t->toksnam,__n);
  sVar1 = fwrite(buf,__n + 4,1,__s);
  if (sVar1 == 1) {
    return;
  }
  errsigf(ctx,"TADS",0x259);
}

Assistant:

static void fiowrtsym(void *ctx0, toksdef *t)
{
    fiowcxdef  *ctx = (fiowcxdef *)ctx0;
    uchar       buf[TOKNAMMAX + 50];
    errcxdef   *ec = ctx->fiowcxerr;
    osfildef   *fp = ctx->fiowcxfp;

    buf[0] = t->tokslen;
    buf[1] = t->tokstyp;
    oswp2(buf + 2, t->toksval);
    memcpy(buf + 4, t->toksnam, (size_t)buf[0]);
    if (osfwb(fp, buf, 4 + t->tokslen)) errsig(ec, ERR_WRTGAM);
}